

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

parser_error parse_flavor_flavor(parser *p)

{
  byte bVar1;
  _Bool _Var2;
  uint uVar3;
  wchar_t wVar4;
  void *pvVar5;
  undefined8 *v;
  char *pcVar6;
  size_t sVar7;
  char *s2;
  int local_34;
  wchar_t d_attr;
  char *attr;
  flavor *f;
  flavor *h;
  parser *p_local;
  
  pvVar5 = parser_priv(p);
  v = (undefined8 *)mem_zalloc(0x20);
  v[1] = pvVar5;
  uVar3 = parser_getuint(p,"index");
  *(uint *)(v + 2) = uVar3;
  *(char *)((long)v + 0x14) = (char)flavor_tval;
  *(wchar_t *)(v + 3) = flavor_glyph;
  _Var2 = parser_hasval(p,"sval");
  if (_Var2) {
    bVar1 = *(byte *)((long)v + 0x14);
    pcVar6 = parser_getsym(p,"sval");
    wVar4 = lookup_sval((uint)bVar1,pcVar6);
    *(char *)((long)v + 0x15) = (char)wVar4;
  }
  else {
    *(undefined1 *)((long)v + 0x15) = 0;
  }
  pcVar6 = parser_getsym(p,"attr");
  sVar7 = strlen(pcVar6);
  if (sVar7 == 1) {
    local_34 = color_char_to_attr(*pcVar6);
  }
  else {
    local_34 = color_text_to_attr(pcVar6);
  }
  if (local_34 < 0) {
    p_local._4_4_ = PARSE_ERROR_INVALID_COLOR;
  }
  else {
    *(char *)((long)v + 0x16) = (char)local_34;
    _Var2 = parser_hasval(p,"desc");
    if (_Var2) {
      pcVar6 = (char *)*v;
      s2 = parser_getstr(p,"desc");
      pcVar6 = string_append(pcVar6,s2);
      *v = pcVar6;
    }
    parser_setpriv(p,v);
    p_local._4_4_ = PARSE_ERROR_NONE;
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_flavor_flavor(struct parser *p) {
	struct flavor *h = parser_priv(p);
	struct flavor *f = mem_zalloc(sizeof *f);

	const char *attr;
	int d_attr;

	f->next = h;

	f->fidx = parser_getuint(p, "index");
	f->tval = flavor_tval;
	f->d_char = flavor_glyph;

	if (parser_hasval(p, "sval"))
		f->sval = lookup_sval(f->tval, parser_getsym(p, "sval"));
	else
		f->sval = SV_UNKNOWN;

	attr = parser_getsym(p, "attr");
	if (strlen(attr) == 1)
		d_attr = color_char_to_attr(attr[0]);
	else
		d_attr = color_text_to_attr(attr);

	if (d_attr < 0)
		return PARSE_ERROR_INVALID_COLOR;
	f->d_attr = d_attr;

	if (parser_hasval(p, "desc"))
		f->text = string_append(f->text, parser_getstr(p, "desc"));

	parser_setpriv(p, f);

	return PARSE_ERROR_NONE;
}